

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fstack.cpp
# Opt level: O0

void fstk_RunInclude(char *path)

{
  bool bVar1;
  int *piVar2;
  char *pcVar3;
  FileStackNode *fileInfo_00;
  char *pcVar4;
  LexerState *pLVar5;
  FileStackNamedNode *fileInfo;
  size_t size;
  char *fullPath;
  char *path_local;
  
  size = 0;
  fileInfo = (FileStackNamedNode *)0x0;
  fullPath = path;
  bVar1 = fstk_FindFile(path,(char **)&size,(size_t *)&fileInfo);
  if (bVar1) {
    fileInfo_00 = (FileStackNode *)malloc((size_t)(fileInfo + 1));
    if (fileInfo_00 == (FileStackNode *)0x0) {
      piVar2 = __errno_location();
      pcVar4 = strerror(*piVar2);
      error("Failed to alloc file info for INCLUDE: %s\n",pcVar4);
    }
    else {
      fileInfo_00->type = NODE_FILE;
      strcpy((char *)(fileInfo_00 + 1),(char *)size);
      free((void *)size);
      newContext(fileInfo_00);
      pLVar5 = lexer_OpenFile((char *)(fileInfo_00 + 1));
      contextStack->lexerState = pLVar5;
      if (contextStack->lexerState == (LexerState *)0x0) {
        fatalerror("Failed to set up lexer for file include\n");
      }
      lexer_SetStateAtEOL(contextStack->lexerState);
      contextStack->uniqueID = contextStack->parent->uniqueID;
    }
  }
  else {
    free((void *)size);
    pcVar4 = fullPath;
    if ((generatedMissingIncludes & 1U) == 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      error("Unable to open included file \'%s\': %s\n",pcVar4,pcVar3);
    }
    else {
      if ((verbose & 1U) != 0) {
        piVar2 = __errno_location();
        pcVar3 = strerror(*piVar2);
        printf("Aborting (-MG) on INCLUDE file \'%s\' (%s)\n",pcVar4,pcVar3);
      }
      failedOnMissingInclude = true;
    }
  }
  return;
}

Assistant:

void fstk_RunInclude(char const *path)
{
	char *fullPath = NULL;
	size_t size = 0;

	if (!fstk_FindFile(path, &fullPath, &size)) {
		free(fullPath);
		if (generatedMissingIncludes) {
			if (verbose)
				printf("Aborting (-MG) on INCLUDE file '%s' (%s)\n",
				       path, strerror(errno));
			failedOnMissingInclude = true;
		} else {
			error("Unable to open included file '%s': %s\n", path, strerror(errno));
		}
		return;
	}

	struct FileStackNamedNode *fileInfo =
		(struct FileStackNamedNode *)malloc(sizeof(*fileInfo) + size);

	if (!fileInfo) {
		error("Failed to alloc file info for INCLUDE: %s\n", strerror(errno));
		return;
	}
	fileInfo->node.type = NODE_FILE;
	strcpy(fileInfo->name, fullPath);
	free(fullPath);

	newContext((struct FileStackNode *)fileInfo);
	contextStack->lexerState = lexer_OpenFile(fileInfo->name);
	if (!contextStack->lexerState)
		fatalerror("Failed to set up lexer for file include\n");
	lexer_SetStateAtEOL(contextStack->lexerState);
	// We're back at top-level, so most things are reset,
	// but not the unique ID, since INCLUDE may be inside a
	// MACRO or REPT/FOR loop
	contextStack->uniqueID = contextStack->parent->uniqueID;
}